

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setOSName(Triple *this,StringRef Str)

{
  bool bVar1;
  StringRef *Str_00;
  Twine *this_00;
  StringRef local_170;
  Twine local_160;
  Twine local_148;
  Twine local_130;
  Twine local_118;
  Twine local_100;
  Twine local_e8;
  Twine local_d0;
  Twine local_b8;
  Twine local_a0;
  StringRef local_88;
  StringRef local_78;
  StringRef local_68;
  Twine local_58;
  Twine local_40;
  
  local_170.Length = Str.Length;
  local_170.Data = Str.Data;
  bVar1 = hasEnvironment(this);
  if (bVar1) {
    local_68 = getArchName(this);
    Twine::Twine(&local_118,&local_68,"-");
    local_78 = getVendorName(this);
    Twine::Twine(&local_130,&local_78);
    Twine::concat(&local_100,&local_118,&local_130);
    Twine::Twine(&local_148,"-");
    Twine::concat(&local_e8,&local_100,&local_148);
    Twine::Twine(&local_160,&local_170);
    Twine::concat(&local_d0,&local_e8,&local_160);
    Twine::Twine(&local_40,"-");
    Twine::concat(&local_b8,&local_d0,&local_40);
    local_88 = getEnvironmentName(this);
    Str_00 = &local_88;
    this_00 = &local_58;
  }
  else {
    local_148._0_16_ = getArchName(this);
    Twine::Twine(&local_e8,(StringRef *)&local_148,"-");
    local_160._0_16_ = getVendorName(this);
    Twine::Twine(&local_100,(StringRef *)&local_160);
    Twine::concat(&local_d0,&local_e8,&local_100);
    Twine::Twine(&local_118,"-");
    Twine::concat(&local_b8,&local_d0,&local_118);
    this_00 = &local_130;
    Str_00 = &local_170;
  }
  Twine::Twine(this_00,Str_00);
  Twine::concat(&local_a0,&local_b8,this_00);
  setTriple(this,&local_a0);
  return;
}

Assistant:

void Triple::setOSName(StringRef Str) {
  if (hasEnvironment())
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str +
              "-" + getEnvironmentName());
  else
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str);
}